

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O0

void __thiscall
covenant::DFA_impl::distinctTable<bool>::distinctTable
          (distinctTable<bool> *this,uint n,bool init_val)

{
  byte in_DL;
  uint in_ESI;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *in_RDI;
  reference rVar1;
  uint j;
  uint i_1;
  uint i;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte bVar2;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff58;
  allocator_type *in_stack_ffffffffffffff60;
  ulong in_stack_ffffffffffffff68;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  reference local_68;
  uint local_54;
  uint local_50;
  vector<bool,_std::allocator<bool>_> local_49;
  uint local_20;
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  std::allocator<std::vector<bool,_std::allocator<bool>_>_>::allocator
            ((allocator<std::vector<bool,_std::allocator<bool>_>_> *)0x230d41);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<std::vector<bool,_std::allocator<bool>_>_>::~allocator
            ((allocator<std::vector<bool,_std::allocator<bool>_>_> *)0x230d64);
  for (local_20 = 0; local_20 < local_c; local_20 = local_20 + 1) {
    in_stack_ffffffffffffff68 = (ulong)local_c;
    in_stack_ffffffffffffff70 = &local_49;
    std::allocator<bool>::allocator((allocator<bool> *)0x230d9e);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff60,
               (size_type)in_stack_ffffffffffffff58,
               (allocator_type *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[](in_RDI,(ulong)local_20);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff58);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x230dde);
    std::allocator<bool>::~allocator((allocator<bool> *)0x230de8);
  }
  for (local_50 = 0; local_50 < local_c; local_50 = local_50 + 1) {
    for (local_54 = 0; local_54 < local_c; local_54 = local_54 + 1) {
      bVar2 = local_d;
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::operator[](in_RDI,(ulong)local_50);
      rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_68 = rVar1;
      std::_Bit_reference::operator=(&local_68,(bool)(bVar2 & 1));
    }
  }
  return;
}

Assistant:

distinctTable(unsigned n, V init_val): M(n) 
       {
         for (unsigned i = 0; i < n; ++i)
           M[i] = vector<V>(n);
         
         for (unsigned i = 0; i < n; ++i)
         {
           for (unsigned j = 0; j < n; ++j)
             M[i][j]=init_val;
         }
       }